

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prodcons6.c
# Opt level: O0

void * consumer(void *arg)

{
  int local_14;
  int i;
  void *arg_local;
  
  for (local_14 = 0; local_14 < nitems; local_14 = local_14 + 1) {
    pthread_mutex_lock((pthread_mutex_t *)&ready);
    while (ready.nready == 0) {
      pthread_cond_wait((pthread_cond_t *)&ready.cond,(pthread_mutex_t *)&ready);
    }
    ready.nready = ready.nready + -1;
    pthread_mutex_unlock((pthread_mutex_t *)&ready);
    if (local_14 != buf[local_14]) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch7/prodcons6.c"
              ,0x40);
      err_sys("buf[%d] = %d",local_14,buf[local_14]);
    }
  }
  printf("consumer finished!\n");
  return (void *)0x0;
}

Assistant:

void *consumer(void *arg) {
    int i;
    for (i = 0; i < nitems; ++i) {
        pthread_mutex_lock(&ready.mutex);
        while (ready.nready == 0) {
            pthread_cond_wait(&ready.cond, &ready.mutex);
        }
        ready.nready--;
        pthread_mutex_unlock(&ready.mutex);
        ASSERT_ERR_SYS(i == buf[i], "buf[%d] = %d", i, buf[i]);
    }
    printf("consumer finished!\n");
    return NULL;
}